

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O1

void CreateBackwardReferencesNH6
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong *puVar1;
  long *plVar2;
  ulong *puVar3;
  ushort uVar4;
  undefined4 uVar5;
  size_t sVar6;
  size_t sVar7;
  uint32_t *puVar8;
  ulong *puVar9;
  BrotliEncoderDictionary *pBVar10;
  ulong *puVar11;
  ulong uVar12;
  uint64_t uVar13;
  HasherCommon *pHVar14;
  uint8_t *puVar15;
  BrotliDictionary *pBVar16;
  undefined8 uVar17;
  bool bVar18;
  ulong uVar19;
  int iVar20;
  ushort uVar21;
  uint32_t uVar22;
  uint uVar23;
  uint uVar24;
  ulong *puVar25;
  ulong *puVar26;
  long lVar27;
  ulong *puVar28;
  byte bVar29;
  long lVar30;
  ulong *puVar31;
  ulong uVar32;
  ulong *puVar33;
  ulong *puVar34;
  uint8_t *puVar35;
  int iVar36;
  long lVar37;
  ulong *puVar38;
  ulong *puVar39;
  ulong *puVar40;
  ulong *unaff_RBP;
  int iVar41;
  ulong *puVar42;
  int *piVar43;
  uint uVar44;
  int iVar45;
  ulong *puVar46;
  ulong *puVar47;
  ulong *puVar48;
  ulong *puVar49;
  ulong *puVar50;
  ulong uVar51;
  ulong *puVar52;
  ulong uVar53;
  int *piVar54;
  ulong uVar55;
  size_t sVar56;
  ulong *unaff_R14;
  ulong *puVar57;
  bool bVar58;
  size_t local_190;
  ulong local_180;
  ulong *local_178;
  ulong local_170;
  int local_15c;
  ulong *local_148;
  ulong *local_130;
  ulong *local_120;
  ulong *local_100;
  Command *local_f0;
  ulong local_e8;
  uint local_d4;
  uint8_t *s1_orig_4;
  uint8_t *s1_orig_1;
  uint16_t *num;
  
  iVar36 = params->lgwin;
  sVar6 = params->stream_offset;
  local_190 = *last_insert_len;
  puVar25 = (ulong *)((position - 7) + num_bytes);
  if (num_bytes < 8) {
    puVar25 = (ulong *)position;
  }
  lVar30 = 0x200;
  if (params->quality < 9) {
    lVar30 = 0x40;
  }
  puVar1 = (ulong *)(position + num_bytes);
  sVar7 = (params->dictionary).compound.total_size;
  iVar41 = (hasher->privat)._H6.num_last_distances_to_check_;
  if (4 < iVar41) {
    iVar45 = *dist_cache;
    dist_cache[4] = iVar45 + -1;
    dist_cache[5] = iVar45 + 1;
    dist_cache[6] = iVar45 + -2;
    dist_cache[7] = iVar45 + 2;
    *(ulong *)(dist_cache + 8) = CONCAT44(iVar45 + 3,iVar45 + -3);
    if (10 < iVar41) {
      iVar41 = dist_cache[1];
      dist_cache[10] = iVar41 + -1;
      dist_cache[0xb] = iVar41 + 1;
      dist_cache[0xc] = iVar41 + -2;
      dist_cache[0xd] = iVar41 + 2;
      *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar41 + 3,iVar41 + -3);
    }
  }
  if ((ulong *)(position + 8) < puVar1) {
    puVar3 = (ulong *)((1L << ((byte)iVar36 & 0x3f)) - 0x10);
    puVar40 = (ulong *)(lVar30 + position);
    puVar8 = (hasher->privat)._H5.buckets_;
    puVar9 = (ulong *)(hasher->privat)._H6.buckets_;
    lVar37 = sVar7 + 1;
    puVar26 = (ulong *)((long)puVar1 - 7);
    local_f0 = commands;
    puVar28 = (ulong *)position;
    do {
      puVar57 = puVar3;
      if (puVar28 < puVar3) {
        puVar57 = puVar28;
      }
      puVar31 = (ulong *)(sVar6 + (long)puVar28);
      if (puVar3 <= (ulong *)(sVar6 + (long)puVar28)) {
        puVar31 = puVar3;
      }
      if ((params->dictionary).contextual.context_based == 0) {
        local_d4 = 0;
        local_e8 = 0;
      }
      else {
        if (puVar28 == (ulong *)0x0) {
          local_e8 = 0;
        }
        else {
          local_e8 = (ulong)ringbuffer[(long)puVar28 - 1U & ringbuffer_mask];
        }
        if (puVar28 < (ulong *)0x2) {
          uVar51 = 0;
        }
        else {
          uVar51 = (ulong)ringbuffer[(long)puVar28 - 2U & ringbuffer_mask];
        }
        local_d4 = (uint)(params->dictionary).contextual.context_map
                         [literal_context_lut[uVar51 + 0x100] | literal_context_lut[local_e8]];
      }
      local_130 = (ulong *)((long)puVar1 - (long)puVar28);
      pBVar10 = (params->dictionary).contextual.dict[local_d4];
      puVar11 = (ulong *)(params->dist).max_distance;
      uVar51 = (ulong)puVar28 & ringbuffer_mask;
      uVar53 = (ulong)(hasher->privat)._H6.num_last_distances_to_check_;
      if (uVar53 == 0) {
        local_170 = 0x7e4;
        local_178 = (ulong *)0x0;
        local_148 = (ulong *)0x0;
        puVar50 = (ulong *)0x0;
      }
      else {
        unaff_R14 = (ulong *)(ringbuffer + uVar51);
        local_170 = 0x7e4;
        puVar50 = (ulong *)0x0;
        uVar55 = 0;
        local_148 = (ulong *)0x0;
        local_178 = (ulong *)0x0;
        do {
          puVar38 = (ulong *)(long)dist_cache[uVar55];
          if (((puVar38 <= puVar57) && ((ulong *)((long)puVar28 - (long)puVar38) < puVar28)) &&
             ((long)puVar50 + uVar51 <= ringbuffer_mask)) {
            uVar32 = (ulong)((long)puVar28 - (long)puVar38) & ringbuffer_mask;
            puVar46 = (ulong *)(uVar32 + (long)puVar50);
            if ((puVar46 <= ringbuffer_mask) &&
               (ringbuffer[(long)puVar50 + uVar51] == ringbuffer[(long)puVar46])) {
              puVar33 = (ulong *)(ringbuffer + uVar32);
              puVar34 = unaff_R14;
              puVar49 = puVar33;
              for (puVar39 = local_130; (ulong *)0x7 < puVar39; puVar39 = puVar39 + -1) {
                uVar32 = *puVar34;
                uVar12 = *puVar49;
                if (uVar32 == uVar12) {
                  puVar49 = puVar49 + 1;
                }
                else {
                  uVar19 = 0;
                  if ((uVar12 ^ uVar32) != 0) {
                    for (; ((uVar12 ^ uVar32) >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                    }
                  }
                  unaff_RBP = (ulong *)((long)puVar49 - (long)puVar33);
                  puVar46 = (ulong *)((uVar19 >> 3 & 0x1fffffff) + (long)unaff_RBP);
                }
                if (uVar32 != uVar12) goto LAB_01d4693e;
                puVar34 = puVar34 + 1;
              }
              puVar46 = puVar49;
              if (puVar39 != (ulong *)0x0) {
                puVar46 = (ulong *)((long)puVar49 + (long)puVar39);
                puVar42 = (ulong *)0x0;
                do {
                  unaff_RBP = (ulong *)CONCAT71((int7)((ulong)unaff_RBP >> 8),
                                                *(char *)((long)puVar49 + (long)puVar42));
                  if (*(char *)((long)puVar49 + (long)puVar42) !=
                      *(char *)((long)puVar34 + (long)puVar42)) {
                    puVar46 = (ulong *)((long)puVar49 + (long)puVar42);
                    break;
                  }
                  puVar42 = (ulong *)((long)puVar42 + 1);
                } while (puVar39 != puVar42);
              }
              puVar46 = (ulong *)((long)puVar46 - (long)puVar33);
LAB_01d4693e:
              if ((((ulong *)0x2 < puVar46) || ((uVar55 < 2 && (puVar46 == (ulong *)0x2)))) &&
                 (uVar32 = (long)puVar46 * 0x87 + 0x78f, local_170 < uVar32)) {
                if (uVar55 != 0) {
                  uVar32 = uVar32 - ((0x1ca10U >> ((byte)uVar55 & 0xe) & 0xe) + 0x27);
                }
                if (local_170 < uVar32) {
                  puVar50 = puVar46;
                  local_178 = puVar38;
                  local_170 = uVar32;
                  local_148 = puVar46;
                }
              }
            }
          }
          uVar55 = uVar55 + 1;
        } while (uVar55 != uVar53);
      }
      uVar13 = (hasher->privat)._H6.hash_mul_;
      plVar2 = (long *)(ringbuffer + uVar51);
      uVar53 = *plVar2 * uVar13 >> 0x31;
      lVar27 = uVar53 << (*(byte *)((long)&hasher->privat + 0x1c) & 0x3f);
      puVar38 = (ulong *)(ringbuffer + uVar51);
      puVar46 = (ulong *)(hasher->privat)._H5.block_size_;
      uVar4 = *(ushort *)((long)puVar8 + uVar53 * 2);
      puVar34 = (ulong *)(ulong)uVar4;
      puVar39 = (ulong *)0x0;
      if (puVar46 <= puVar34) {
        puVar39 = (ulong *)((long)puVar34 - (long)puVar46);
      }
      do {
        if (puVar34 <= puVar39) break;
        puVar34 = (ulong *)((long)puVar34 + -1);
        uVar44 = *(uint *)((long)puVar9 +
                          (ulong)((hasher->privat)._H6.block_mask_ & (uint)puVar34) * 4 + lVar27 * 4
                          );
        puVar49 = (ulong *)((long)puVar28 - (ulong)uVar44);
        if ((puVar49 <= puVar57) && ((long)puVar50 + uVar51 <= ringbuffer_mask)) {
          uVar55 = (ulong)(uVar44 & (uint)ringbuffer_mask);
          if ((uVar55 + (long)puVar50 <= ringbuffer_mask) &&
             ((ringbuffer[(long)puVar50 + uVar51] == ringbuffer[uVar55 + (long)puVar50] &&
              ((int)*plVar2 == *(int *)(ringbuffer + uVar55))))) {
            puVar47 = (ulong *)(ringbuffer + uVar55 + 4);
            puVar33 = (ulong *)((long)plVar2 + 4);
            puVar42 = puVar47;
            for (piVar43 = (int *)((long)local_130 + -4); (int *)0x7 < piVar43;
                piVar43 = piVar43 + -2) {
              uVar55 = *puVar33;
              uVar32 = *puVar42;
              if (uVar55 == uVar32) {
                puVar42 = puVar42 + 1;
              }
              else {
                uVar12 = 0;
                if ((uVar32 ^ uVar55) != 0) {
                  for (; ((uVar32 ^ uVar55) >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                  }
                }
                unaff_RBP = (ulong *)((long)puVar42 - (long)puVar47);
                unaff_R14 = (ulong *)((uVar12 >> 3 & 0x1fffffff) + (long)unaff_RBP);
              }
              if (uVar55 != uVar32) goto LAB_01d46b73;
              puVar33 = puVar33 + 1;
            }
            puVar48 = puVar42;
            if (piVar43 != (int *)0x0) {
              puVar48 = (ulong *)((long)puVar42 + (long)piVar43);
              piVar54 = (int *)0x0;
              do {
                unaff_RBP = (ulong *)CONCAT71((int7)((ulong)unaff_RBP >> 8),
                                              *(char *)((long)puVar42 + (long)piVar54));
                if (*(char *)((long)puVar42 + (long)piVar54) !=
                    *(char *)((long)puVar33 + (long)piVar54)) {
                  puVar48 = (ulong *)((long)puVar42 + (long)piVar54);
                  break;
                }
                piVar54 = (int *)((long)piVar54 + 1);
              } while (piVar43 != piVar54);
            }
            unaff_R14 = (ulong *)((long)puVar48 - (long)puVar47);
LAB_01d46b73:
            unaff_R14 = (ulong *)((long)unaff_R14 + 4);
            iVar36 = 0x1f;
            if ((uint)puVar49 != 0) {
              for (; (uint)puVar49 >> iVar36 == 0; iVar36 = iVar36 + -1) {
              }
            }
            uVar55 = (ulong)(iVar36 * -0x1e + 0x780) + (long)unaff_R14 * 0x87;
            if (local_170 < uVar55) {
              puVar50 = unaff_R14;
              local_178 = puVar49;
              local_170 = uVar55;
              local_148 = unaff_R14;
            }
          }
        }
      } while (puVar49 <= puVar57);
      *(int *)((long)puVar9 +
              (ulong)((hasher->privat)._H6.block_mask_ & (uint)uVar4) * 4 + lVar27 * 4) =
           (int)puVar28;
      uVar44 = uVar4 + 1;
      puVar57 = (ulong *)(ulong)uVar44;
      *(short *)((long)puVar8 + uVar53 * 2) = (short)uVar44;
      local_15c = 0;
      if ((local_170 == 0x7e4) &&
         (pHVar14 = (hasher->privat)._H6.common_,
         pHVar14->dict_num_lookups >> 7 <= pHVar14->dict_num_matches)) {
        uVar51 = (ulong)((uint)((int)*puVar38 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
        puVar15 = pBVar10->hash_table_lengths;
        sVar56 = pHVar14->dict_num_lookups;
        local_15c = 0;
        lVar27 = 0;
        do {
          sVar56 = sVar56 + 1;
          pHVar14->dict_num_lookups = sVar56;
          bVar29 = puVar15[uVar51];
          puVar50 = (ulong *)(ulong)bVar29;
          if (puVar50 != (ulong *)0x0) {
            bVar58 = true;
            if (puVar50 <= local_130) {
              pBVar16 = pBVar10->words;
              puVar35 = pBVar16->data +
                        (ulong)pBVar16->offsets_by_length[(long)puVar50] +
                        (ulong)pBVar10->hash_table_words[uVar51] * (long)puVar50;
              puVar39 = puVar50;
              unaff_R14 = puVar38;
              if (7 < bVar29) {
                do {
                  unaff_RBP = *(ulong **)puVar35;
                  puVar34 = (ulong *)*unaff_R14;
                  if (unaff_RBP == puVar34) {
                    unaff_R14 = unaff_R14 + 1;
                  }
                  else {
                    uVar53 = 0;
                    if (((ulong)puVar34 ^ (ulong)unaff_RBP) != 0) {
                      for (; (((ulong)puVar34 ^ (ulong)unaff_RBP) >> uVar53 & 1) == 0;
                          uVar53 = uVar53 + 1) {
                      }
                    }
                    puVar57 = (ulong *)((long)unaff_R14 +
                                       ((uVar53 >> 3 & 0x1fffffff) - (long)puVar38));
                  }
                  if (unaff_RBP != puVar34) goto LAB_01d46d3f;
                  puVar35 = puVar35 + 8;
                  puVar39 = puVar39 + -1;
                } while ((ulong *)0x7 < puVar39);
              }
              puVar57 = unaff_R14;
              if (puVar39 != (ulong *)0x0) {
                puVar57 = (ulong *)((long)unaff_R14 + (long)puVar39);
                puVar34 = (ulong *)0x0;
                do {
                  unaff_RBP = (ulong *)CONCAT71((int7)((ulong)unaff_RBP >> 8),
                                                *(uint8_t *)((long)unaff_R14 + (long)puVar34));
                  if (*(uint8_t *)((long)unaff_R14 + (long)puVar34) != puVar35[(long)puVar34]) {
                    puVar57 = (ulong *)((long)unaff_R14 + (long)puVar34);
                    break;
                  }
                  puVar34 = (ulong *)((long)puVar34 + 1);
                } while (puVar39 != puVar34);
              }
              puVar57 = (ulong *)((long)puVar57 - (long)puVar38);
              unaff_R14 = puVar57;
LAB_01d46d3f:
              if (((puVar57 != (ulong *)0x0) &&
                  (puVar50 < (ulong *)((ulong)pBVar10->cutoffTransformsCount + (long)puVar57))) &&
                 (puVar50 = (ulong *)((long)puVar31 +
                                     ((ulong)((uint)(pBVar10->cutoffTransforms >>
                                                    ((char)((long)puVar50 - (long)puVar57) * '\x06'
                                                    & 0x3fU)) & 0x3f) +
                                      ((long)puVar50 - (long)puVar57) * 4 <<
                                     (pBVar16->size_bits_by_length[(long)puVar50] & 0x3f)) +
                                     (ulong)pBVar10->hash_table_words[uVar51] + lVar37),
                 puVar50 <= puVar11)) {
                iVar36 = 0x1f;
                if ((uint)puVar50 != 0) {
                  for (; (uint)puVar50 >> iVar36 == 0; iVar36 = iVar36 + -1) {
                  }
                }
                uVar53 = ((long)puVar57 * 0x87 - (ulong)(uint)(iVar36 * 0x1e)) + 0x780;
                if (local_170 <= uVar53) {
                  local_15c = (uint)bVar29 - (int)puVar57;
                  bVar58 = false;
                  local_178 = puVar50;
                  local_170 = uVar53;
                  local_148 = puVar57;
                }
              }
            }
            if (!bVar58) {
              pHVar14->dict_num_matches = pHVar14->dict_num_matches + 1;
            }
          }
          uVar51 = uVar51 + 1;
          bVar58 = lVar27 == 0;
          lVar27 = lVar27 + 1;
        } while (bVar58);
      }
      if (local_170 < 0x7e5) {
        local_190 = local_190 + 1;
        position = (long)puVar28 + 1;
        if (puVar40 < position) {
          if ((ulong *)((ulong)(uint)((int)lVar30 * 4) + (long)puVar40) < position) {
            puVar57 = (ulong *)((long)puVar28 + 0x11);
            if (puVar26 <= (ulong *)((long)puVar28 + 0x11)) {
              puVar57 = puVar26;
            }
            if (position < puVar57) {
              uVar44 = (hasher->privat)._H6.block_mask_;
              uVar5 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
              do {
                uVar51 = *(long *)(ringbuffer + (position & ringbuffer_mask)) * uVar13 >> 0x31;
                uVar4 = *(ushort *)((long)puVar8 + uVar51 * 2);
                *(ushort *)((long)puVar8 + uVar51 * 2) = uVar4 + 1;
                *(int *)((long)puVar9 +
                        (ulong)(uVar44 & uVar4) * 4 + (uVar51 << ((byte)uVar5 & 0x3f)) * 4) =
                     (int)position;
                local_190 = local_190 + 4;
                position = position + 4;
                unaff_RBP = puVar57;
                unaff_R14 = puVar9;
              } while (position < puVar57);
            }
          }
          else {
            puVar57 = (ulong *)((long)puVar28 + 9);
            if (puVar26 <= (ulong *)((long)puVar28 + 9)) {
              puVar57 = puVar26;
            }
            if (position < puVar57) {
              uVar44 = (hasher->privat)._H6.block_mask_;
              uVar5 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
              do {
                uVar51 = *(long *)(ringbuffer + (position & ringbuffer_mask)) * uVar13 >> 0x31;
                uVar4 = *(ushort *)((long)puVar8 + uVar51 * 2);
                *(ushort *)((long)puVar8 + uVar51 * 2) = uVar4 + 1;
                *(int *)((long)puVar9 +
                        (ulong)(uVar44 & uVar4) * 4 + (uVar51 << ((byte)uVar5 & 0x3f)) * 4) =
                     (int)position;
                local_190 = local_190 + 2;
                position = position + 2;
                unaff_RBP = puVar57;
                unaff_R14 = puVar9;
              } while (position < puVar57);
            }
          }
        }
      }
      else {
        iVar36 = (hasher->privat)._H6.num_last_distances_to_check_;
        uVar44 = (hasher->privat)._H6.block_mask_;
        uVar5 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
        iVar41 = 0;
        do {
          puVar40 = (ulong *)((long)local_130 - 1);
          puVar57 = (ulong *)((long)local_148 - 1U);
          if (puVar40 <= (ulong *)((long)local_148 - 1U)) {
            puVar57 = puVar40;
          }
          if (4 < params->quality) {
            puVar57 = (ulong *)0x0;
          }
          puVar31 = (ulong *)((long)puVar28 + 1);
          puVar50 = puVar3;
          if (puVar31 < puVar3) {
            puVar50 = puVar31;
          }
          puVar38 = (ulong *)((long)puVar28 + sVar6 + 1);
          if (puVar3 <= puVar38) {
            puVar38 = puVar3;
          }
          if ((params->dictionary).contextual.context_based != 0) {
            local_d4 = (uint)(params->dictionary).contextual.context_map
                             [literal_context_lut[local_e8 + 0x100] |
                              literal_context_lut[ringbuffer[(ulong)puVar28 & ringbuffer_mask]]];
            local_e8 = (ulong)ringbuffer[(ulong)puVar28 & ringbuffer_mask];
          }
          uVar51 = (ulong)puVar31 & ringbuffer_mask;
          pBVar10 = (params->dictionary).contextual.dict[local_d4];
          if (iVar36 == 0) {
            local_180 = 0x7e4;
            local_120 = (ulong *)0x0;
            local_100 = (ulong *)0x0;
          }
          else {
            local_180 = 0x7e4;
            unaff_RBP = (ulong *)0x0;
            local_100 = (ulong *)0x0;
            local_120 = (ulong *)0x0;
            do {
              puVar39 = (ulong *)(long)dist_cache[(long)unaff_RBP];
              if (((puVar39 <= puVar50) && ((ulong *)((long)puVar31 - (long)puVar39) < puVar31)) &&
                 ((long)puVar57 + uVar51 <= ringbuffer_mask)) {
                uVar53 = (ulong)((long)puVar31 - (long)puVar39) & ringbuffer_mask;
                puVar34 = (ulong *)(uVar53 + (long)puVar57);
                if ((puVar34 <= ringbuffer_mask) &&
                   (ringbuffer[(long)puVar57 + uVar51] == ringbuffer[(long)puVar34])) {
                  puVar47 = (ulong *)(ringbuffer + uVar53);
                  puVar33 = (ulong *)(ringbuffer + uVar51);
                  puVar42 = puVar47;
                  for (puVar49 = puVar40; (ulong *)0x7 < puVar49; puVar49 = puVar49 + -1) {
                    uVar53 = *puVar33;
                    uVar55 = *puVar42;
                    if (uVar53 == uVar55) {
                      puVar42 = puVar42 + 1;
                    }
                    else {
                      uVar32 = 0;
                      if ((uVar55 ^ uVar53) != 0) {
                        for (; ((uVar55 ^ uVar53) >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                        }
                      }
                      puVar34 = (ulong *)((long)puVar42 +
                                         ((uVar32 >> 3 & 0x1fffffff) - (long)puVar47));
                    }
                    if (uVar53 != uVar55) goto LAB_01d4701e;
                    puVar33 = puVar33 + 1;
                  }
                  puVar34 = puVar42;
                  if (puVar49 != (ulong *)0x0) {
                    puVar34 = (ulong *)((long)puVar42 + (long)puVar49);
                    puVar48 = (ulong *)0x0;
                    do {
                      if (*(char *)((long)puVar42 + (long)puVar48) !=
                          *(char *)((long)puVar33 + (long)puVar48)) {
                        puVar34 = (ulong *)((long)puVar42 + (long)puVar48);
                        break;
                      }
                      puVar48 = (ulong *)((long)puVar48 + 1);
                    } while (puVar49 != puVar48);
                  }
                  puVar34 = (ulong *)((long)puVar34 - (long)puVar47);
LAB_01d4701e:
                  if ((((ulong *)0x2 < puVar34) ||
                      ((unaff_RBP < (ulong *)0x2 && (puVar34 == (ulong *)0x2)))) &&
                     (uVar53 = (long)puVar34 * 0x87 + 0x78f, local_180 < uVar53)) {
                    if (unaff_RBP != (ulong *)0x0) {
                      uVar53 = uVar53 - ((0x1ca10U >> ((byte)unaff_RBP & 0xe) & 0xe) + 0x27);
                    }
                    if (local_180 < uVar53) {
                      puVar57 = puVar34;
                      local_180 = uVar53;
                      local_120 = puVar39;
                      local_100 = puVar34;
                    }
                  }
                }
              }
              unaff_RBP = (ulong *)((long)unaff_RBP + 1);
            } while (unaff_RBP != (ulong *)(long)iVar36);
          }
          plVar2 = (long *)(ringbuffer + uVar51);
          uVar53 = *plVar2 * uVar13 >> 0x31;
          lVar27 = uVar53 << ((byte)uVar5 & 0x3f);
          puVar39 = (ulong *)(ringbuffer + uVar51);
          uVar4 = *(ushort *)((long)puVar8 + uVar53 * 2);
          puVar49 = (ulong *)(ulong)uVar4;
          puVar34 = (ulong *)0x0;
          if (puVar46 <= puVar49) {
            puVar34 = (ulong *)((long)puVar49 - (long)puVar46);
          }
          do {
            if (puVar49 <= puVar34) break;
            puVar49 = (ulong *)((long)puVar49 + -1);
            uVar23 = *(uint *)((long)puVar9 +
                              (ulong)((hasher->privat)._H6.block_mask_ & (uint)puVar49) * 4 +
                              lVar27 * 4);
            puVar33 = (ulong *)((long)puVar31 - (ulong)uVar23);
            if ((puVar33 <= puVar50) && ((long)puVar57 + uVar51 <= ringbuffer_mask)) {
              uVar55 = (ulong)(uVar23 & (uint)ringbuffer_mask);
              if ((uVar55 + (long)puVar57 <= ringbuffer_mask) &&
                 ((ringbuffer[(long)puVar57 + uVar51] == ringbuffer[uVar55 + (long)puVar57] &&
                  ((int)*plVar2 == *(int *)(ringbuffer + uVar55))))) {
                puVar48 = (ulong *)(ringbuffer + uVar55 + 4);
                puVar42 = (ulong *)((long)plVar2 + 4);
                puVar47 = puVar48;
                for (uVar55 = (long)local_130 - 5; 7 < uVar55; uVar55 = uVar55 - 8) {
                  uVar32 = *puVar42;
                  uVar12 = *puVar47;
                  if (uVar32 == uVar12) {
                    puVar47 = puVar47 + 1;
                  }
                  else {
                    uVar19 = 0;
                    if ((uVar12 ^ uVar32) != 0) {
                      for (; ((uVar12 ^ uVar32) >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                      }
                    }
                    unaff_RBP = (ulong *)((long)puVar47 +
                                         ((uVar19 >> 3 & 0x1fffffff) - (long)puVar48));
                  }
                  if (uVar32 != uVar12) goto LAB_01d47237;
                  puVar42 = puVar42 + 1;
                }
                puVar52 = puVar47;
                if (uVar55 != 0) {
                  puVar52 = (ulong *)((long)puVar47 + uVar55);
                  uVar32 = 0;
                  do {
                    if (*(char *)((long)puVar47 + uVar32) != *(char *)((long)puVar42 + uVar32)) {
                      puVar52 = (ulong *)((long)puVar47 + uVar32);
                      break;
                    }
                    uVar32 = uVar32 + 1;
                  } while (uVar55 != uVar32);
                }
                unaff_RBP = (ulong *)((long)puVar52 - (long)puVar48);
LAB_01d47237:
                unaff_RBP = (ulong *)((long)unaff_RBP + 4);
                iVar45 = 0x1f;
                if ((uint)puVar33 != 0) {
                  for (; (uint)puVar33 >> iVar45 == 0; iVar45 = iVar45 + -1) {
                  }
                }
                uVar55 = (ulong)(iVar45 * -0x1e + 0x780) + (long)unaff_RBP * 0x87;
                if (local_180 < uVar55) {
                  puVar57 = unaff_RBP;
                  local_180 = uVar55;
                  local_120 = puVar33;
                  local_100 = unaff_RBP;
                }
              }
            }
          } while (puVar33 <= puVar50);
          *(int *)((long)puVar9 + (ulong)(uVar44 & uVar4) * 4 + lVar27 * 4) = (int)puVar31;
          *(ushort *)((long)puVar8 + uVar53 * 2) = uVar4 + 1;
          if (local_180 == 0x7e4) {
            pHVar14 = (hasher->privat)._H6.common_;
            if (pHVar14->dict_num_matches < pHVar14->dict_num_lookups >> 7) {
              iVar45 = 0;
            }
            else {
              uVar51 = (ulong)((uint)((int)*puVar39 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
              unaff_RBP = (ulong *)pBVar10->hash_table_lengths;
              sVar56 = pHVar14->dict_num_lookups;
              iVar45 = 0;
              lVar27 = 0;
              do {
                sVar56 = sVar56 + 1;
                pHVar14->dict_num_lookups = sVar56;
                bVar29 = *(byte *)((long)unaff_RBP + uVar51);
                puVar57 = (ulong *)(ulong)bVar29;
                if (puVar57 != (ulong *)0x0) {
                  bVar58 = true;
                  if (puVar57 <= puVar40) {
                    pBVar16 = pBVar10->words;
                    puVar33 = (ulong *)(pBVar16->data +
                                       (ulong)pBVar16->offsets_by_length[(long)puVar57] +
                                       (ulong)pBVar10->hash_table_words[uVar51] * (long)puVar57);
                    puVar50 = puVar57;
                    puVar49 = puVar39;
                    if (7 < bVar29) {
                      do {
                        uVar53 = *puVar33;
                        uVar55 = *puVar49;
                        if (uVar53 == uVar55) {
                          puVar49 = puVar49 + 1;
                        }
                        else {
                          uVar32 = 0;
                          if ((uVar55 ^ uVar53) != 0) {
                            for (; ((uVar55 ^ uVar53) >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                            }
                          }
                          puVar34 = (ulong *)((long)puVar49 +
                                             ((uVar32 >> 3 & 0x1fffffff) - (long)puVar39));
                        }
                        if (uVar53 != uVar55) goto LAB_01d4746c;
                        puVar33 = puVar33 + 1;
                        puVar50 = puVar50 + -1;
                      } while ((ulong *)0x7 < puVar50);
                    }
                    puVar34 = puVar49;
                    if (puVar50 != (ulong *)0x0) {
                      puVar34 = (ulong *)((long)puVar50 + (long)puVar49);
                      puVar42 = (ulong *)0x0;
                      do {
                        if (*(char *)((long)puVar49 + (long)puVar42) !=
                            *(char *)((long)puVar33 + (long)puVar42)) {
                          puVar34 = (ulong *)((long)puVar49 + (long)puVar42);
                          break;
                        }
                        puVar42 = (ulong *)((long)puVar42 + 1);
                      } while (puVar50 != puVar42);
                    }
                    puVar34 = (ulong *)((long)puVar34 - (long)puVar39);
LAB_01d4746c:
                    if (((puVar34 != (ulong *)0x0) &&
                        (puVar57 < (ulong *)((ulong)pBVar10->cutoffTransformsCount + (long)puVar34))
                        ) && (puVar57 = (ulong *)((long)puVar38 +
                                                 ((ulong)((uint)(pBVar10->cutoffTransforms >>
                                                                ((char)((long)puVar57 -
                                                                       (long)puVar34) * '\x06' &
                                                                0x3fU)) & 0x3f) +
                                                  ((long)puVar57 - (long)puVar34) * 4 <<
                                                 (pBVar16->size_bits_by_length[(long)puVar57] & 0x3f
                                                 )) + (ulong)pBVar10->hash_table_words[uVar51] +
                                                      lVar37), puVar57 <= puVar11)) {
                      iVar20 = 0x1f;
                      if ((uint)puVar57 != 0) {
                        for (; (uint)puVar57 >> iVar20 == 0; iVar20 = iVar20 + -1) {
                        }
                      }
                      uVar53 = ((long)puVar34 * 0x87 - (ulong)(uint)(iVar20 * 0x1e)) + 0x780;
                      if (local_180 <= uVar53) {
                        iVar45 = (uint)bVar29 - (int)puVar34;
                        bVar58 = false;
                        local_180 = uVar53;
                        local_120 = puVar57;
                        local_100 = puVar34;
                      }
                    }
                  }
                  if (!bVar58) {
                    pHVar14->dict_num_matches = pHVar14->dict_num_matches + 1;
                  }
                }
                uVar51 = uVar51 + 1;
                bVar58 = lVar27 == 0;
                lVar27 = lVar27 + 1;
              } while (bVar58);
            }
          }
          else {
            iVar45 = 0;
          }
          bVar58 = local_170 + 0xaf <= local_180;
          unaff_R14 = puVar28;
          iVar20 = iVar41;
          if (bVar58) {
            local_190 = local_190 + 1;
            local_170 = local_180;
            local_178 = local_120;
            local_148 = local_100;
            unaff_R14 = puVar31;
            local_15c = iVar45;
            iVar20 = iVar41 + 1;
          }
          bVar18 = iVar41 < 3;
          puVar57 = (ulong *)((long)puVar28 + 9);
          puVar28 = unaff_R14;
          local_130 = puVar40;
          iVar41 = iVar20;
        } while (bVar58 && (bVar18 && puVar57 < puVar1));
        puVar40 = (ulong *)((long)unaff_R14 + sVar6);
        if (puVar3 <= (ulong *)((long)unaff_R14 + sVar6)) {
          puVar40 = puVar3;
        }
        puVar40 = (ulong *)((long)puVar40 + sVar7);
        if (puVar40 < local_178) {
LAB_01d4774e:
          uVar51 = (long)local_178 + 0xf;
        }
        else {
          uVar44 = 0;
          bVar58 = false;
          if (local_178 != (ulong *)(long)*dist_cache) {
            if (local_178 == (ulong *)(long)dist_cache[1]) {
              uVar44 = 1;
            }
            else {
              uVar51 = (long)local_178 + (3 - (long)*dist_cache);
              if (uVar51 < 7) {
                bVar29 = (byte)((int)uVar51 << 2);
                uVar44 = 0x9750468;
              }
              else {
                uVar51 = (long)local_178 + (3 - (long)dist_cache[1]);
                if (6 < uVar51) {
                  if (local_178 != (ulong *)(long)dist_cache[2]) {
                    bVar58 = local_178 != (ulong *)(long)dist_cache[3];
                    uVar44 = 3;
                    goto LAB_01d47745;
                  }
                  uVar44 = 2;
                  goto LAB_01d47743;
                }
                bVar29 = (byte)((int)uVar51 << 2);
                uVar44 = 0xfdb1ace;
              }
              uVar44 = uVar44 >> (bVar29 & 0x1f) & 0xf;
            }
LAB_01d47743:
            bVar58 = false;
          }
LAB_01d47745:
          if (bVar58) goto LAB_01d4774e;
          uVar51 = (ulong)uVar44;
        }
        if ((local_178 <= puVar40) && (uVar51 != 0)) {
          dist_cache[3] = dist_cache[2];
          uVar17 = *(undefined8 *)dist_cache;
          *(undefined8 *)(dist_cache + 1) = uVar17;
          iVar41 = (int)local_178;
          *dist_cache = iVar41;
          iVar36 = (hasher->privat)._H6.num_last_distances_to_check_;
          if (4 < iVar36) {
            dist_cache[4] = iVar41 + -1;
            dist_cache[5] = iVar41 + 1;
            dist_cache[6] = iVar41 + -2;
            dist_cache[7] = iVar41 + 2;
            dist_cache[8] = iVar41 + -3;
            dist_cache[9] = iVar41 + 3;
            if (10 < iVar36) {
              iVar36 = (int)uVar17;
              dist_cache[10] = iVar36 + -1;
              dist_cache[0xb] = iVar36 + 1;
              dist_cache[0xc] = iVar36 + -2;
              dist_cache[0xd] = iVar36 + 2;
              *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar36 + 3,iVar36 + -3);
            }
          }
        }
        uVar44 = (uint)local_190;
        local_f0->insert_len_ = uVar44;
        local_f0->copy_len_ = local_15c << 0x19 | (uint)local_148;
        uVar55 = (ulong)(params->dist).num_direct_distance_codes;
        uVar53 = uVar55 + 0x10;
        if (uVar51 < uVar53) {
          local_f0->dist_prefix_ = (uint16_t)uVar51;
          uVar22 = 0;
        }
        else {
          uVar22 = (params->dist).distance_postfix_bits;
          bVar29 = (byte)uVar22;
          uVar51 = ((uVar51 - uVar55) + (4L << (bVar29 & 0x3f))) - 0x10;
          uVar23 = 0x1f;
          if ((uint)uVar51 != 0) {
            for (; (uint)uVar51 >> uVar23 == 0; uVar23 = uVar23 - 1) {
            }
          }
          uVar23 = (uVar23 ^ 0xffffffe0) + 0x1f;
          bVar58 = (uVar51 >> ((ulong)uVar23 & 0x3f) & 1) != 0;
          iVar36 = uVar23 - uVar22;
          local_f0->dist_prefix_ =
               (short)((uint)bVar58 + iVar36 * 2 + 0xfffe << (bVar29 & 0x3f)) +
               (short)uVar53 + (~(ushort)(-1 << (bVar29 & 0x1f)) & (ushort)uVar51) |
               (short)iVar36 * 0x400;
          uVar22 = (uint32_t)
                   (uVar51 - ((ulong)bVar58 + 2 << ((byte)uVar23 & 0x3f)) >> (bVar29 & 0x3f));
        }
        local_f0->dist_extra_ = uVar22;
        if (5 < local_190) {
          if (local_190 < 0x82) {
            uVar44 = 0x1f;
            uVar23 = (uint)(local_190 - 2);
            if (uVar23 != 0) {
              for (; uVar23 >> uVar44 == 0; uVar44 = uVar44 - 1) {
              }
            }
            uVar44 = (int)(local_190 - 2 >> ((char)(uVar44 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar44 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (local_190 < 0x842) {
            uVar23 = 0x1f;
            if (uVar44 - 0x42 != 0) {
              for (; uVar44 - 0x42 >> uVar23 == 0; uVar23 = uVar23 - 1) {
              }
            }
            uVar44 = (uVar23 ^ 0xffe0) + 0x2a;
          }
          else {
            uVar44 = 0x15;
            if (0x1841 < local_190) {
              uVar44 = (uint)(ushort)(0x17 - (local_190 < 0x5842));
            }
          }
        }
        uVar23 = local_15c + (uint)local_148;
        if (uVar23 < 10) {
          uVar24 = uVar23 - 2;
        }
        else if (uVar23 < 0x86) {
          uVar23 = uVar23 - 6;
          uVar24 = 0x1f;
          if (uVar23 != 0) {
            for (; uVar23 >> uVar24 == 0; uVar24 = uVar24 - 1) {
            }
          }
          uVar24 = (int)((ulong)(long)(int)uVar23 >> ((char)(uVar24 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar24 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar24 = 0x17;
          if (uVar23 < 0x846) {
            uVar24 = 0x1f;
            if (uVar23 - 0x46 != 0) {
              for (; uVar23 - 0x46 >> uVar24 == 0; uVar24 = uVar24 - 1) {
              }
            }
            uVar24 = (uVar24 ^ 0xffe0) + 0x2c;
          }
        }
        uVar4 = (ushort)uVar24;
        uVar21 = (uVar4 & 7) + ((ushort)uVar44 & 7) * 8;
        if ((((local_f0->dist_prefix_ & 0x3ff) == 0) && ((ushort)uVar44 < 8)) && (uVar4 < 0x10)) {
          if (7 < uVar4) {
            uVar21 = uVar21 | 0x40;
          }
        }
        else {
          iVar36 = ((uVar44 & 0xffff) >> 3) * 3 + ((uVar24 & 0xffff) >> 3);
          uVar21 = uVar21 + ((ushort)(0x520d40 >> ((char)iVar36 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar36 * 0x40 + 0x40;
        }
        local_f0->cmd_prefix_ = uVar21;
        *num_literals = *num_literals + local_190;
        position = (long)unaff_R14 + (long)local_148;
        puVar28 = puVar25;
        if (position < puVar25) {
          puVar28 = (ulong *)position;
        }
        puVar57 = (ulong *)((long)unaff_R14 + 2);
        if (local_178 < (ulong *)((ulong)local_148 >> 2)) {
          puVar40 = (ulong *)(position + (long)local_178 * -4);
          if (puVar40 < puVar57) {
            puVar40 = puVar57;
          }
          puVar57 = puVar40;
          if (puVar28 < puVar40) {
            puVar57 = puVar28;
          }
        }
        puVar40 = (ulong *)(lVar30 + (long)local_148 * 2 + (long)unaff_R14);
        local_f0 = local_f0 + 1;
        if (puVar57 < puVar28) {
          uVar13 = (hasher->privat)._H6.hash_mul_;
          uVar44 = (hasher->privat)._H6.block_mask_;
          uVar5 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
          do {
            uVar51 = *(long *)(ringbuffer + ((ulong)puVar57 & ringbuffer_mask)) * uVar13 >> 0x31;
            uVar4 = *(ushort *)((long)puVar8 + uVar51 * 2);
            *(ushort *)((long)puVar8 + uVar51 * 2) = uVar4 + 1;
            *(int *)((long)puVar9 +
                    (ulong)(uVar44 & uVar4) * 4 + (uVar51 << ((byte)uVar5 & 0x3f)) * 4) =
                 (int)puVar57;
            puVar57 = (ulong *)((long)puVar57 + 1);
          } while (puVar28 != puVar57);
          local_190 = 0;
          unaff_RBP = puVar9;
          unaff_R14 = (ulong *)ringbuffer_mask;
        }
        else {
          local_190 = 0;
        }
      }
      puVar28 = (ulong *)position;
    } while ((ulong *)(position + 8) < puVar1);
  }
  else {
    local_f0 = commands;
  }
  *last_insert_len = (long)puVar1 + (local_190 - position);
  *num_commands = *num_commands + ((long)local_f0 - (long)commands >> 4);
  return;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}